

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O2

void __thiscall
chrono::ChGlyphs::SetGlyphVector
          (ChGlyphs *this,uint id,ChVector<double> *mpoint,ChVector<double> *mvector,ChColor *mcolor
          )

{
  float fVar1;
  ChVector<double> *pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  ulong uVar5;
  
  pCVar3 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)id;
  if ((ulong)(((long)(this->points).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x18) <= uVar5) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
    pCVar3 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar2 = pCVar3 + uVar5;
  if (pCVar2 != mpoint) {
    pCVar2->m_data[0] = mpoint->m_data[0];
    pCVar2->m_data[1] = mpoint->m_data[1];
    pCVar2->m_data[2] = mpoint->m_data[2];
  }
  pCVar3 = (this->vectors).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->vectors).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x18) <= uVar5) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->vectors,(ulong)(id + 1));
    pCVar3 = (this->vectors).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar2 = pCVar3 + uVar5;
  if (pCVar2 != mvector) {
    pCVar2->m_data[0] = mvector->m_data[0];
    pCVar2->m_data[1] = mvector->m_data[1];
    pCVar2->m_data[2] = mvector->m_data[2];
  }
  pCVar4 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->colors).
                     super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar4) / 0xc) <= uVar5) {
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize
              (&this->colors,(ulong)(id + 1));
    pCVar4 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  pCVar4 = pCVar4 + uVar5;
  if (pCVar4 != mcolor) {
    fVar1 = mcolor->G;
    pCVar4->R = mcolor->R;
    pCVar4->G = fVar1;
    pCVar4->B = mcolor->B;
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphVector(unsigned int id, ChVector<> mpoint, ChVector<> mvector, ChColor mcolor) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mpoint;

    if (vectors.size() <= id)
        vectors.resize(id + 1);
    vectors[id] = mvector;

    if (colors.size() <= id)
        colors.resize(id + 1);
    colors[id] = mcolor;
}